

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O2

void __thiscall libchars::commands::lexer(commands *this)

{
  token *ptVar1;
  string local_38;
  
  ptVar1 = this->t_cmd;
  if (ptVar1 != (token *)0x0) {
    token::~token(ptVar1);
  }
  operator_delete(ptVar1,0x90);
  this->t_par = (token *)0x0;
  value_abi_cxx11_(&local_38,this);
  ptVar1 = libchars::lexer(&local_38);
  this->t_cmd = ptVar1;
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void commands::lexer()
    {
        delete t_cmd;
        t_par = NULL;
        t_cmd = libchars::lexer(value());
    }